

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O3

void __thiscall
Diffusion::diffuse_scalar
          (Diffusion *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *S_old,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *Rho_old,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *S_new,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *Rho_new,int S_comp,
          int nComp,int Rho_comp,Real prev_time,Real curr_time,Real be_cn_theta,MultiFab *rho_half,
          int rho_flag,MultiFab **fluxn,MultiFab **fluxnp1,int fluxComp,MultiFab *delta_rhs,
          int rhsComp,MultiFab *alpha_in,int alpha_in_comp,MultiFab **betan,MultiFab **betanp1,
          int betaComp,IntVect *cratio,BCRec *bc,Geometry *geom,bool add_old_time_divFlux,
          Vector<int,_std::allocator<int>_> *a_is_diffusive)

{
  BoxArray *bxs;
  DistributionMapping *dm;
  ostringstream *poVar1;
  pointer ppMVar2;
  MultiFab *pMVar3;
  __uniq_ptr_data<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>,_true,_true>
  factory;
  void *pvVar4;
  Real a_tol_rel;
  uint uVar5;
  FabArray<amrex::FArrayBox> *this_00;
  FabArray<amrex::FArrayBox> *pFVar6;
  MultiFab *pMVar7;
  long lVar8;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *pVVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  double *pdVar13;
  int idim_1;
  long lVar14;
  long lVar15;
  double *pdVar16;
  long lVar17;
  int iVar18;
  Diffusion *pDVar19;
  long lVar20;
  undefined4 in_register_0000008c;
  long lVar21;
  long lVar22;
  double *pdVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  BoxArray *pBVar29;
  double *pdVar30;
  int idim;
  long lVar31;
  bool bVar32;
  double dVar33;
  Real a_tol_abs;
  double dVar34;
  initializer_list<amrex::Geometry> __l;
  initializer_list<amrex::BoxArray> __l_00;
  initializer_list<amrex::DistributionMapping> __l_01;
  initializer_list<const_amrex::EBFArrayBoxFactory_*> __l_02;
  initializer_list<amrex::Geometry> __l_03;
  initializer_list<amrex::BoxArray> __l_04;
  initializer_list<amrex::DistributionMapping> __l_05;
  initializer_list<const_amrex::EBFArrayBoxFactory_*> __l_06;
  initializer_list<amrex::MultiFab_*> __l_07;
  initializer_list<amrex::MultiFab_*> __l_08;
  initializer_list<amrex::MultiFab_*> __l_09;
  initializer_list<const_amrex::MultiFab_*> __l_10;
  pair<double,_double> scalars;
  int allnull;
  Real rhsscale;
  int allthere;
  MultiFab rhs_tmp;
  array<amrex::LinOpBCType,_3UL> mlmg_hibc;
  array<amrex::LinOpBCType,_3UL> mlmg_lobc;
  MultiFab Soln;
  MLMG mgnp1;
  MLEBABecLap opn;
  MLMG mgn;
  MultiFab Rhs;
  MLEBABecLap opnp1;
  DistributionMapping *local_1458;
  long local_1450;
  ulong local_1448;
  long local_1438;
  long local_1420;
  long local_13d8;
  undefined1 local_13b8 [24];
  pointer local_13a0;
  undefined8 uStack_1398;
  int local_1390;
  undefined8 local_1370;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_1368;
  FabArray<amrex::FArrayBox> *local_1360;
  int local_1358;
  allocator_type local_1352;
  allocator_type local_1351;
  Array4<const_double> local_1350;
  Real local_1310;
  Array4<double> local_1308;
  ulong local_12c8;
  long local_12c0;
  double *local_12b8;
  double *local_12b0;
  FabArray<amrex::FArrayBox> *local_12a8;
  uint local_12a0;
  int local_129c;
  Array4<const_double> local_1298;
  long local_1250;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_1248;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_1240;
  ulong local_1238;
  ulong local_1230;
  int local_1228;
  int local_1224;
  MultiFab *local_1220;
  Diffusion *local_1218;
  long local_1210;
  long local_1208;
  long local_1200;
  long local_11f8;
  long local_11f0;
  Array4<const_double> local_11e8;
  Box local_11a4;
  double local_1188;
  long local_1180;
  double *local_1178;
  ulong local_1170;
  long local_1168;
  long local_1160;
  long local_1158;
  long local_1150;
  long local_1148;
  long local_1140;
  long local_1138;
  long local_1130;
  long local_1128;
  long local_1120;
  long local_1118;
  long local_1110;
  long local_1108;
  long local_1100;
  long local_10f8;
  long local_10f0;
  long local_10e8;
  long local_10e0;
  long local_10d8;
  long local_10d0;
  long local_10c8;
  long local_10c0;
  long local_10b8;
  long local_10b0;
  double *local_10a8;
  ulong local_10a0;
  long local_1098;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1090;
  long local_1088;
  long local_1080;
  LPInfo local_1074;
  int local_1054;
  undefined1 local_1050 [204];
  int local_f84;
  LPInfo local_ec8;
  Array4<const_double> local_ea8;
  Array4<const_double> local_e68;
  array<amrex::LinOpBCType,_3UL> local_e28;
  array<amrex::LinOpBCType,_3UL> local_e1c;
  FabArray<amrex::FArrayBox> local_e10;
  undefined1 local_c90 [28];
  int local_c74;
  undefined1 local_af8 [8];
  Arena *local_af0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_ae8;
  int local_acc;
  MLMG local_720;
  FabArray<amrex::FArrayBox> local_588;
  MLEBABecLap local_408;
  
  local_1370 = CONCAT44(in_register_0000008c,S_comp);
  local_1368 = S_old;
  local_1310 = be_cn_theta;
  local_1248 = Rho_new;
  local_1240 = Rho_old;
  if (verbose != 0) {
    local_af0 = (Arena *)amrex::OutStream();
    local_af8._4_4_ = *(MPI_Comm *)(DAT_00816950 + -0x48);
    local_af8._0_4_ = *(int *)(DAT_00816950 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&vStack_ae8);
    *(undefined8 *)
     ((long)&vStack_ae8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish +
     vStack_ae8.
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
         *(undefined8 *)
          ((long)&(local_af0->arena_info).release_threshold + (long)local_af0->_vptr_Arena[-3]);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&vStack_ae8,"... Diffusion::diffuse_scalar(): \n",0x22);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vStack_ae8," lev: ",6);
    std::ostream::operator<<((ostringstream *)&vStack_ae8,this->level);
    local_408.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vStack_ae8,(char *)&local_408,1);
    amrex::Print::~Print((Print *)local_af8);
  }
  local_1218 = this;
  if (0 < (int)local_1370 + nComp && (int)local_1370 < 1) {
    amrex::Abort_host(
                     "Diffusion::diffuse_scalar(): velocity component(s) attemping to use scalar solver. Velocity must use tensor solver.\n"
                     );
  }
  iVar18 = *(a_is_diffusive->super_vector<int,_std::allocator<int>_>).
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if (1 < nComp) {
    uVar26 = 1;
    do {
      if ((a_is_diffusive->super_vector<int,_std::allocator<int>_>).
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [uVar26] != iVar18) {
        amrex::Abort_host(
                         "All the scalars must be either diffusive or non-diffusive when calling diffuse_scalar"
                         );
      }
      uVar26 = uVar26 + 1;
    } while ((uint)nComp != uVar26);
  }
  if (iVar18 == 0) {
    lVar27 = 0;
    do {
      if ((&fluxn[lVar27]->super_FabArray<amrex::FArrayBox> != (FabArray<amrex::FArrayBox> *)0x0) &&
         (fluxnp1[lVar27] != (MultiFab *)0x0)) {
        local_af8 = (undefined1  [8])0x0;
        local_af0 = (Arena *)((ulong)local_af0 & 0xffffffff00000000);
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  (&fluxn[lVar27]->super_FabArray<amrex::FArrayBox>,0.0,fluxComp,nComp,
                   (IntVect *)local_af8);
        local_af8 = (undefined1  [8])0x0;
        local_af0 = (Arena *)((ulong)local_af0 & 0xffffffff00000000);
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  (&fluxnp1[lVar27]->super_FabArray<amrex::FArrayBox>,0.0,fluxComp,nComp,
                   (IntVect *)local_af8);
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
  }
  else {
    local_1250 = (long)(S_new->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                       super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(S_new->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                       super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
    local_1188 = amrex::ParallelDescriptor::second();
    pDVar19 = (Diffusion *)betan;
    checkBeta(betan,&local_1054,&local_1224);
    checkBeta(pDVar19,betanp1,&local_1054);
    bVar32 = local_1310 != 1.0;
    if ((bVar32 && add_old_time_divFlux) && (local_1224 != 0)) {
      amrex::Abort_host(
                       "Diffusion::diffuse_scalar: Constant diffusivity case no longer supported separately. Must set non-zero beta."
                       );
    }
    ppMVar2 = (S_new->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pMVar7 = *ppMVar2;
    bxs = &(pMVar7->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
    dm = &(pMVar7->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
    if (local_1250 < 9) {
      local_1458 = (DistributionMapping *)0x0;
      pBVar29 = (BoxArray *)0x0;
    }
    else {
      pMVar3 = ppMVar2[1];
      local_1458 = &(pMVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
      pBVar29 = &(pMVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
    }
    factory.
    super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
         (pMVar7->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
         super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    ;
    local_af8 = (undefined1  [8])0x1;
    local_af0 = (Arena *)0x0;
    vStack_ae8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_ae8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_ae8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    amrex::MultiFab::MultiFab
              ((MultiFab *)&local_588,bxs,dm,nComp,0,(MFInfo *)local_af8,
               (FabFactory<amrex::FArrayBox> *)
               factory.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_ae8);
    local_af8 = (undefined1  [8])0x1;
    local_af0 = (Arena *)0x0;
    vStack_ae8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_ae8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_ae8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    amrex::MultiFab::MultiFab
              ((MultiFab *)&local_e10,bxs,dm,nComp,1,(MFInfo *)local_af8,
               (FabFactory<amrex::FArrayBox> *)
               factory.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_ae8);
    this_00 = (FabArray<amrex::FArrayBox> *)operator_new(0x180);
    amrex::MultiFab::MultiFab((MultiFab *)this_00);
    if (8 < local_1250) {
      local_af8 = (undefined1  [8])0x1;
      local_af0 = (Arena *)0x0;
      vStack_ae8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_ae8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_ae8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (*(this_00->super_FabArrayBase)._vptr_FabArrayBase[2])
                (this_00,pBVar29,local_1458,(ulong)(uint)nComp,0,local_af8,
                 (tuple<amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                  )((S_new->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[1]->super_FabArray<amrex::FArrayBox>).
                   m_factory._M_t.
                   super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                );
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vStack_ae8);
    }
    local_ec8.do_semicoarsening = false;
    local_ec8.agg_grid_size = -1;
    local_ec8.con_grid_size = -1;
    local_ec8.do_agglomeration = (anonymous_namespace)::agglomeration != 0;
    local_ec8.has_metric_term = true;
    local_ec8.do_consolidation = (anonymous_namespace)::consolidation != 0;
    local_ec8.max_coarsening_level = 0;
    local_ec8.max_semicoarsening_level = 0;
    local_ec8.semicoarsening_direction = -1;
    local_ec8.hidden_direction = -1;
    pFVar6 = (FabArray<amrex::FArrayBox> *)
             __dynamic_cast(factory.
                            super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                            .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                            _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                            &amrex::EBFArrayBoxFactory::typeinfo,0);
    if (pFVar6 == (FabArray<amrex::FArrayBox> *)0x0) {
      __cxa_bad_cast();
    }
    memcpy(&local_408,geom,200);
    __l._M_len = 1;
    __l._M_array = (iterator)&local_408;
    std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
              ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)local_c90,__l,
               (allocator_type *)&local_11e8);
    amrex::BoxArray::BoxArray((BoxArray *)&local_720,bxs);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_720;
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
              ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)local_1050,__l_00,
               (allocator_type *)&local_ea8);
    local_1308.p = *(double **)
                    &(pMVar7->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap.
                     m_ref.
                     super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
    ;
    local_1308.jstride =
         (Long)(pMVar7->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap.m_ref.
               super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1308.jstride !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1308.jstride)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1308.jstride)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1308.jstride)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1308.jstride)->_M_use_count + 1;
      }
    }
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)&local_1308;
    std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::vector
              ((vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               local_13b8,__l_01,(allocator_type *)&local_e68);
    __l_02._M_len = 1;
    __l_02._M_array = (iterator)&local_1298;
    local_1298.p = (double *)pFVar6;
    std::
    vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>::
    vector((vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
            *)&local_1350,__l_02,(allocator_type *)&local_1074);
    amrex::MLEBABecLap::MLEBABecLap
              ((MLEBABecLap *)local_af8,
               (Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)local_c90,
               (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)local_1050,
               (Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               local_13b8,&local_ec8,
               (Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                *)&local_1350,nComp);
    if (local_1350.p != (double *)0x0) {
      operator_delete(local_1350.p,local_1350.kstride - (long)local_1350.p);
    }
    std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~vector
              ((vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               local_13b8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1308.jstride !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1308.jstride);
    }
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector
              ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)local_1050);
    amrex::BoxArray::~BoxArray((BoxArray *)&local_720);
    pvVar4 = (void *)CONCAT44(local_c90._4_4_,local_c90._0_4_);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,local_c90._16_8_ - (long)pvVar4);
    }
    local_acc = max_order;
    amrex::MLMG::MLMG(&local_720,(MLLinOp *)local_af8);
    local_1074.do_semicoarsening = false;
    local_1074.agg_grid_size = -1;
    local_1074.con_grid_size = -1;
    local_1074.has_metric_term = true;
    local_1074.do_agglomeration = (anonymous_namespace)::agglomeration != 0;
    local_1074.max_coarsening_level = 0x1e;
    local_1074.max_semicoarsening_level = 0;
    local_1074.semicoarsening_direction = -1;
    local_1074.hidden_direction = -1;
    local_1074.do_consolidation = (anonymous_namespace)::consolidation != 0;
    local_720.verbose = verbose;
    memcpy((iterator)local_c90,geom,200);
    __l_03._M_len = 1;
    __l_03._M_array = (iterator)local_c90;
    std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
              ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)local_13b8,__l_03,
               (allocator_type *)&local_e68);
    amrex::BoxArray::BoxArray((BoxArray *)local_1050,bxs);
    __l_04._M_len = 1;
    __l_04._M_array = (iterator)local_1050;
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
              ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&local_1350,__l_04,
               (allocator_type *)&local_11a4);
    local_11e8.p = *(double **)
                    &(pMVar7->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap.
                     m_ref.
                     super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
    ;
    local_11e8.jstride =
         (Long)(pMVar7->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap.m_ref.
               super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_11e8.jstride !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_11e8.jstride)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_11e8.jstride)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_11e8.jstride)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_11e8.jstride)->_M_use_count + 1;
      }
    }
    __l_05._M_len = 1;
    __l_05._M_array = (iterator)&local_11e8;
    std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::vector
              ((vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               &local_1308,__l_05,&local_1351);
    __l_06._M_len = 1;
    __l_06._M_array = (iterator)&local_ea8;
    local_ea8.p = (double *)pFVar6;
    std::
    vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>::
    vector((vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
            *)&local_1298,__l_06,&local_1352);
    amrex::MLEBABecLap::MLEBABecLap
              (&local_408,(Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)local_13b8,
               (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&local_1350,
               (Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               &local_1308,&local_1074,
               (Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                *)&local_1298,nComp);
    if ((FabArray<amrex::FArrayBox> *)local_1298.p != (FabArray<amrex::FArrayBox> *)0x0) {
      operator_delete(local_1298.p,local_1298.kstride - (long)local_1298.p);
    }
    std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~vector
              ((vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               &local_1308);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_11e8.jstride !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_11e8.jstride);
    }
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector
              ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&local_1350);
    amrex::BoxArray::~BoxArray((BoxArray *)local_1050);
    if ((pointer)local_13b8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_13b8._0_8_,local_13b8._16_8_ - local_13b8._0_8_);
    }
    local_408.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.maxorder = max_order;
    amrex::MLMG::MLMG((MLMG *)local_c90,(MLLinOp *)&local_408);
    local_c74 = (anonymous_namespace)::max_fmg_iter;
    local_c90._0_4_ = verbose;
    setDomainBC(&local_e1c,&local_e28,bc);
    amrex::MLLinOp::setDomainBC((MLLinOp *)local_af8,&local_e1c,&local_e28);
    amrex::MLLinOp::setDomainBC((MLLinOp *)&local_408,&local_e1c,&local_e28);
    if (verbose != 0) {
      local_1050._8_8_ = amrex::OutStream();
      poVar1 = (ostringstream *)(local_1050 + 0x10);
      local_1050._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
      local_1050._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      *(undefined8 *)
       ((long)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1050._16_8_ + -0x18))->_M_pi[1]
               ._M_use_count + (long)local_1050) =
           *(undefined8 *)
            ((ostream *)(local_1050._8_8_ + 8) + *(long *)(*(long *)local_1050._8_8_ + -0x18));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"diffusing of ",0xd);
      std::ostream::operator<<(poVar1,nComp);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," scalars \n",10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"rho flag ",9);
      std::ostream::operator<<(poVar1,rho_flag);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
      amrex::Print::~Print((Print *)local_1050);
    }
    local_1358 = Rho_comp;
    dVar33 = curr_time - prev_time;
    if (bVar32 && add_old_time_divFlux) {
      local_1360 = pFVar6;
      if (verbose != 0) {
        local_1050._8_8_ = amrex::OutStream();
        local_1050._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
        local_1050._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1050 + 0x10));
        *(undefined8 *)
         ((long)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1050._16_8_ + -0x18))->_M_pi
                 [1]._M_use_count + (long)local_1050) =
             *(undefined8 *)
              ((ostream *)(local_1050._8_8_ + 8) + *(long *)(*(long *)local_1050._8_8_ + -0x18));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1050 + 0x10),"Adding old time diff ...\n",0x19);
        amrex::Print::~Print((Print *)local_1050);
      }
      if (8 < local_1250) {
        amrex::MultiFab::Copy
                  ((MultiFab *)this_00,
                   (local_1368->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>)
                   .super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[1],(int)local_1370,0,nComp,0);
        if (rho_flag == 2) {
          amrex::MFIter::MFIter((MFIter *)local_1050,(FabArrayBase *)this_00,true);
          if ((int)local_1050._32_4_ < (int)local_1050._40_4_) {
            do {
              amrex::MFIter::tilebox((Box *)&local_1308,(MFIter *)local_1050);
              amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                        ((Array4<double> *)local_13b8,this_00,(MFIter *)local_1050);
              amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                        (&local_1350,
                         &(local_1240->
                          super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[1]->
                          super_FabArray<amrex::FArrayBox>,(MFIter *)local_1050,Rho_comp);
              if ((int)local_1308.jstride <= local_1308.kstride._4_4_) {
                local_1458 = (DistributionMapping *)(local_1308.jstride & 0xffffffff);
                do {
                  if (local_1308.p._4_4_ <= (int)local_1308.kstride) {
                    pdVar30 = (double *)
                              (local_13b8._0_8_ +
                              ((long)(int)local_1458 - (long)local_1390) * local_13b8._16_8_ * 8 +
                              ((long)local_1308.p._4_4_ - (long)uStack_1398._4_4_) *
                              local_13b8._8_8_ * 8 + (long)(int)local_1308.p * 8 +
                              (long)(int)uStack_1398 * -8);
                    lVar27 = (long)local_1308.p._4_4_;
                    do {
                      if ((int)local_1308.p <= local_1308.jstride._4_4_) {
                        pdVar13 = pdVar30;
                        lVar21 = (long)(int)local_1308.p;
                        do {
                          if (0 < nComp) {
                            dVar34 = local_1350.p
                                     [((long)(int)local_1458 - (long)local_1350.begin.z) *
                                      local_1350.kstride +
                                      (lVar27 - local_1350.begin.y) * local_1350.jstride +
                                      (lVar21 - local_1350.begin.x)];
                            uVar26 = (ulong)(uint)nComp;
                            pdVar16 = pdVar13;
                            do {
                              *pdVar16 = *pdVar16 * (1.0 / dVar34);
                              pdVar16 = pdVar16 + (long)local_13a0;
                              uVar26 = uVar26 - 1;
                            } while (uVar26 != 0);
                          }
                          lVar21 = lVar21 + 1;
                          pdVar13 = pdVar13 + 1;
                        } while (local_1308.jstride._4_4_ + 1 != (int)lVar21);
                      }
                      lVar27 = lVar27 + 1;
                      pdVar30 = pdVar30 + local_13b8._8_8_;
                    } while ((int)local_1308.kstride + 1 != (int)lVar27);
                  }
                  bVar32 = (int)local_1458 != local_1308.kstride._4_4_;
                  local_1458 = (DistributionMapping *)(ulong)((int)local_1458 + 1);
                } while (bVar32);
              }
              amrex::MFIter::operator++((MFIter *)local_1050);
            } while ((int)local_1050._32_4_ < (int)local_1050._40_4_);
          }
          amrex::MFIter::~MFIter((MFIter *)local_1050);
        }
        amrex::MLLinOp::setCoarseFineBC((MLLinOp *)local_af8,(MultiFab *)this_00,cratio->vect[0]);
      }
      amrex::MultiFab::Copy
                ((MultiFab *)&local_e10,
                 *(local_1368->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                  super__Vector_impl_data._M_start,(int)local_1370,0,nComp,1);
      if (rho_flag == 2) {
        amrex::MFIter::MFIter((MFIter *)local_1050,&local_e10.super_FabArrayBase,true);
        if ((int)local_1050._32_4_ < (int)local_1050._40_4_) {
          do {
            amrex::MFIter::growntilebox((Box *)&local_1308,(MFIter *)local_1050,1);
            amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      ((Array4<double> *)local_13b8,&local_e10,(MFIter *)local_1050);
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_1350,
                       &(*(local_1240->
                          super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_start)->
                        super_FabArray<amrex::FArrayBox>,(MFIter *)local_1050,Rho_comp);
            if ((int)local_1308.jstride <= local_1308.kstride._4_4_) {
              local_1458 = (DistributionMapping *)(local_1308.jstride & 0xffffffff);
              do {
                if (local_1308.p._4_4_ <= (int)local_1308.kstride) {
                  pdVar30 = (double *)
                            (local_13b8._0_8_ +
                            ((long)(int)local_1458 - (long)local_1390) * local_13b8._16_8_ * 8 +
                            ((long)local_1308.p._4_4_ - (long)uStack_1398._4_4_) *
                            local_13b8._8_8_ * 8 + (long)(int)local_1308.p * 8 +
                            (long)(int)uStack_1398 * -8);
                  lVar27 = (long)local_1308.p._4_4_;
                  do {
                    if ((int)local_1308.p <= local_1308.jstride._4_4_) {
                      pdVar13 = pdVar30;
                      lVar21 = (long)(int)local_1308.p;
                      do {
                        if (0 < nComp) {
                          dVar34 = local_1350.p
                                   [((long)(int)local_1458 - (long)local_1350.begin.z) *
                                    local_1350.kstride +
                                    (lVar27 - local_1350.begin.y) * local_1350.jstride +
                                    (lVar21 - local_1350.begin.x)];
                          uVar26 = (ulong)(uint)nComp;
                          pdVar16 = pdVar13;
                          do {
                            *pdVar16 = *pdVar16 * (1.0 / dVar34);
                            pdVar16 = pdVar16 + (long)local_13a0;
                            uVar26 = uVar26 - 1;
                          } while (uVar26 != 0);
                        }
                        lVar21 = lVar21 + 1;
                        pdVar13 = pdVar13 + 1;
                      } while (local_1308.jstride._4_4_ + 1 != (int)lVar21);
                    }
                    lVar27 = lVar27 + 1;
                    pdVar30 = pdVar30 + local_13b8._8_8_;
                  } while ((int)local_1308.kstride + 1 != (int)lVar27);
                }
                bVar32 = (int)local_1458 != local_1308.kstride._4_4_;
                local_1458 = (DistributionMapping *)(ulong)((int)local_1458 + 1);
              } while (bVar32);
            }
            amrex::MFIter::operator++((MFIter *)local_1050);
          } while ((int)local_1050._32_4_ < (int)local_1050._40_4_);
        }
        amrex::MFIter::~MFIter((MFIter *)local_1050);
      }
      amrex::MLCellLinOp::setLevelBC
                ((MLCellLinOp *)local_af8,0,(MultiFab *)&local_e10,(MultiFab *)0x0,(MultiFab *)0x0,
                 (MultiFab *)0x0);
      dVar34 = -(1.0 - local_1310) * dVar33;
      amrex::MLEBABecLap::setScalars((MLEBABecLap *)local_af8,0.0,dVar34);
      setBeta((MLEBABecLap *)local_af8,betan,betaComp,nComp);
      local_13b8._0_8_ = (pointer)0x1;
      local_13b8._8_8_ = (pointer)0x0;
      local_13b8._16_8_ = (pointer)0x0;
      local_13a0 = (pointer)0x0;
      uStack_1398 = (pointer)0x0;
      amrex::MultiFab::MultiFab
                ((MultiFab *)local_1050,bxs,dm,nComp,2,(MFInfo *)local_13b8,
                 (FabFactory<amrex::FArrayBox> *)
                 factory.
                 super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_13b8 + 0x10));
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)local_1050,0.0,0,local_f84,
                 (IntVect *)(local_1050 + 0xc0));
      __l_07._M_len = 1;
      __l_07._M_array = (iterator)&local_1308;
      local_1308.p = (double *)local_1050;
      std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
                ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_13b8,__l_07,
                 (allocator_type *)&local_11e8);
      __l_08._M_len = 1;
      __l_08._M_array = (iterator)&local_1298;
      local_1298.p = (double *)&local_e10;
      std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
                ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_1350,__l_08
                 ,(allocator_type *)&local_ea8);
      amrex::MLMG::apply(&local_720,
                         (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_13b8
                         ,(Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                          &local_1350);
      if (local_1350.p != (double *)0x0) {
        operator_delete(local_1350.p,local_1350.kstride - (long)local_1350.p);
      }
      if ((pointer)local_13b8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_13b8._0_8_,local_13b8._16_8_ - local_13b8._0_8_);
      }
      pMVar7 = amrex::EBDataCollection::getVolFrac
                         ((EBDataCollection *)
                          (((FabArray<amrex::FArrayBox> *)&local_1360->super_FabArrayBase)->
                          super_FabArrayBase).m_bdkey.m_dm_id.data);
      amrex::single_level_weighted_redistribute
                ((MultiFab *)local_1050,(MultiFab *)&local_588,pMVar7,0,nComp,geom);
      computeExtensiveFluxes
                (&local_720,(MultiFab *)&local_e10,fluxn,fluxComp,nComp,
                 (MultiFab *)&local_1218->navier_stokes->field_0x540,-dVar34 / dVar33);
      amrex::MultiFab::~MultiFab((MultiFab *)local_1050);
    }
    else {
      lVar27 = 0;
      do {
        local_1050._0_8_ =
             (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
        local_1050._8_8_ = local_1050._8_8_ & 0xffffffff00000000;
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  (&fluxn[lVar27]->super_FabArray<amrex::FArrayBox>,0.0,fluxComp,nComp,
                   (IntVect *)local_1050);
        lVar27 = lVar27 + 1;
      } while (lVar27 != 3);
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (&local_588,0.0,0,local_588.super_FabArrayBase.n_comp,
                 &local_588.super_FabArrayBase.n_grow);
    }
    amrex::MFIter::MFIter
              ((MFIter *)local_1050,
               (FabArrayBase *)
               *(S_new->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                super__Vector_impl_data._M_start,true);
    local_1220 = rho_half;
    if ((int)local_1050._32_4_ < (int)local_1050._40_4_) {
      local_1170 = (ulong)(uint)nComp;
      do {
        amrex::MFIter::tilebox(&local_11a4,(MFIter *)local_1050);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)local_13b8,&local_588,(MFIter *)local_1050);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&local_1350,&local_e10,(MFIter *)local_1050);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_1308,
                   &(*(S_new->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start)->super_FabArray<amrex::FArrayBox>,
                   (MFIter *)local_1050,(int)local_1370);
        if (rho_flag == 1) {
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_1298,&rho_half->super_FabArray<amrex::FArrayBox>,(MFIter *)local_1050);
LAB_0037bd8a:
          local_11e8.kstride = 0;
          local_11e8.nstride = 0;
          local_11e8.p = (double *)0x0;
          local_11e8.jstride = 0;
          local_11e8.begin.x = 1;
          local_11e8.begin.y = 1;
          local_11e8.begin.z = 1;
          local_11e8.end.x = 0;
          local_11e8.end.y = 0;
          local_11e8.end.z = 0;
          local_11e8.ncomp = 0;
        }
        else {
          local_1298.kstride = 0;
          local_1298.nstride = 0;
          local_1298.p = (double *)0x0;
          local_1298.jstride = 0;
          local_1298.begin.x = 1;
          local_1298.begin.y = 1;
          local_1298.begin.z = 1;
          local_1298.end.x = 0;
          local_1298.end.y = 0;
          local_1298.end.z = 0;
          local_1298.ncomp = 0;
          if (rho_flag != 3) goto LAB_0037bd8a;
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_11e8,
                     &(*(local_1240->
                        super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                        _M_impl.super__Vector_impl_data._M_start)->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)local_1050,Rho_comp);
        }
        if (alpha_in == (MultiFab *)0x0) {
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_ea8,&local_e10,(MFIter *)local_1050);
        }
        else {
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_ea8,&alpha_in->super_FabArray<amrex::FArrayBox>,(MFIter *)local_1050,
                     alpha_in_comp);
        }
        if (delta_rhs == (MultiFab *)0x0) {
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_e68,&local_e10,(MFIter *)local_1050);
        }
        else {
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_e68,&delta_rhs->super_FabArray<amrex::FArrayBox>,(MFIter *)local_1050,
                     rhsComp);
        }
        if (0 < nComp) {
          local_1080 = (long)local_1298.begin.y;
          lVar27 = (long)local_1298.begin.x;
          local_1088 = (long)local_1350.begin.y;
          local_11f0 = (long)local_11a4.smallend.vect[1];
          lVar21 = (long)local_11a4.smallend.vect[0];
          local_12c0 = local_1350.jstride;
          local_12c8 = local_1298.jstride;
          local_1368 = (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                       (local_ea8.jstride * 8);
          local_1360 = (FabArray<amrex::FArrayBox> *)(local_e68.jstride * 8);
          local_1178 = local_1350.p;
          local_11f8 = (local_11f0 - local_1088) * local_1350.jstride * 8 + lVar21 * 8 +
                       (long)local_1350.begin.x * -8 + (long)local_1350.p;
          local_1200 = (local_11f0 - local_1308.begin.y) * local_1308.jstride * 8 + lVar21 * 8 +
                       (long)local_1308.begin.x * -8 + (long)local_1308.p;
          local_10c0 = (long)local_1350.begin.z;
          local_10c8 = -local_10c0;
          local_1150 = local_1308.nstride * 8;
          local_10d0 = CONCAT44(local_1308.kstride._4_4_,(int)local_1308.kstride) * 8;
          local_10d8 = -(long)local_1308.begin.z;
          local_10b0 = (local_11f0 - local_1080) * local_1298.jstride * 8 + lVar21 * 8 + lVar27 * -8
                       + (long)local_1298.p;
          local_10e0 = (long)local_1298.begin.z;
          local_10e8 = -local_10e0;
          local_12a8 = (FabArray<amrex::FArrayBox> *)
                       CONCAT44(local_12a8._4_4_,local_11a4.bigend.vect[0]);
          local_1228 = (local_11a4.bigend.vect[0] - local_11a4.smallend.vect[0]) + 1;
          local_1208 = (local_11f0 - uStack_1398._4_4_) * local_13b8._8_8_ * 8 + lVar21 * 8 +
                       (long)(int)uStack_1398 * -8 + local_13b8._0_8_;
          local_1158 = (long)local_13a0 * 8;
          local_10f0 = local_13b8._16_8_ * 8;
          local_10f8 = -(long)local_1390;
          local_10b8 = (local_11f0 - local_ea8.begin.y) * (long)local_1368 + lVar21 * 8 +
                       (long)local_ea8.begin.x * -8 + (long)local_ea8.p;
          local_1100 = local_ea8.kstride * 8;
          local_1108 = -(long)local_ea8.begin.z;
          local_1210 = (local_11f0 - local_e68.begin.y) * (long)local_1360 + lVar21 * 8 +
                       (long)local_e68.begin.x * -8 + (long)local_e68.p;
          local_1160 = local_e68.nstride * 8;
          local_1110 = local_e68.kstride * 8;
          local_1118 = -(long)local_e68.begin.z;
          local_1090 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_11e8.jstride;
          local_1130 = local_11e8.kstride;
          local_1138 = (long)local_11e8.begin.z;
          local_12a0 = local_11a4.smallend.vect[2];
          local_1098 = (long)local_11e8.begin.y;
          local_129c = local_11a4.bigend.vect[2];
          local_10a0 = (ulong)(uint)local_11a4.bigend.vect[1];
          local_12b0 = (double *)CONCAT44(local_12b0._4_4_,local_11a4.bigend.vect[1] + 1U);
          local_1180 = local_1350.nstride;
          local_1168 = local_1350.nstride * 8;
          local_1120 = local_1350.kstride;
          local_1140 = local_1350.kstride * 8;
          local_1128 = local_1298.kstride;
          local_1148 = local_1298.kstride * 8;
          local_1238 = 0;
          do {
            if (local_11a4.smallend.vect[2] <= local_11a4.bigend.vect[2]) {
              local_10a8 = local_1350.p + local_1238 * local_1350.nstride;
              local_1230 = (ulong)(uint)local_11a4.smallend.vect[2];
              do {
                if (local_11a4.smallend.vect[1] <= local_11a4.bigend.vect[1]) {
                  lVar17 = (long)(int)local_1230;
                  lVar28 = (local_10c8 + lVar17) * local_1140 + local_11f8;
                  lVar8 = (local_10d8 + lVar17) * local_10d0 + local_1200;
                  local_1420 = (local_10e8 + lVar17) * local_1148 + local_10b0;
                  lVar25 = (local_10f8 + lVar17) * local_10f0 + local_1208;
                  lVar15 = (local_1108 + lVar17) * local_1100 + local_10b8;
                  lVar31 = (local_1118 + lVar17) * local_1110 + local_1210;
                  local_12b8 = local_10a8 +
                               ((int)local_1230 - local_1350.begin.z) * local_1350.kstride;
                  lVar10 = ((int)local_1230 - local_1298.begin.z) * local_1298.kstride;
                  local_1438 = local_11f0;
                  do {
                    if (local_11a4.smallend.vect[0] <= local_11a4.bigend.vect[0]) {
                      lVar11 = (local_1438 - local_1080) * local_1298.jstride;
                      lVar22 = 0;
                      lVar12 = lVar21;
                      iVar18 = local_1228;
                      do {
                        if (delta_rhs == (MultiFab *)0x0) {
LAB_0037c4cf:
                          dVar34 = *(double *)(lVar8 + lVar22);
                          pdVar30 = local_12b8 +
                                    (local_1438 - local_1088) * local_1350.jstride +
                                    (lVar12 - local_1350.begin.x);
                          *(double *)(lVar28 + lVar22) = dVar34;
                          lVar14 = (lVar17 - local_1138) * local_11e8.kstride;
                          pFVar6 = (FabArray<amrex::FArrayBox> *)local_11e8.p;
                          lVar20 = (local_1438 - local_1098) * local_11e8.jstride;
                          lVar24 = (long)local_11e8.begin.x;
                          if ((rho_flag == 3) ||
                             (lVar14 = lVar10, pFVar6 = (FabArray<amrex::FArrayBox> *)local_1298.p,
                             lVar20 = lVar11, lVar24 = lVar27, rho_flag == 1)) goto LAB_0037c51a;
                          pdVar30 = (double *)(lVar22 + lVar28);
                        }
                        else {
                          dVar34 = *(double *)(lVar31 + lVar22) * dVar33 +
                                   *(double *)(lVar25 + lVar22);
                          *(double *)(lVar25 + lVar22) = dVar34;
                          if (rho_flag != 1) goto LAB_0037c4cf;
                          *(double *)(lVar25 + lVar22) = dVar34 * *(double *)(local_1420 + lVar22);
                          dVar34 = *(double *)(lVar8 + lVar22);
                          pdVar30 = (double *)(lVar22 + lVar28);
                          *(double *)(lVar28 + lVar22) = dVar34;
                          lVar14 = lVar10;
                          pFVar6 = (FabArray<amrex::FArrayBox> *)local_1298.p;
                          lVar20 = lVar11;
                          lVar24 = lVar27;
LAB_0037c51a:
                          dVar34 = dVar34 * *(double *)
                                             ((long)pFVar6 +
                                             lVar22 + lVar20 * 8 + lVar14 * 8 + lVar24 * -8 +
                                                      lVar21 * 8);
                          *pdVar30 = dVar34;
                        }
                        if (alpha_in != (MultiFab *)0x0) {
                          dVar34 = dVar34 * *(double *)(lVar15 + lVar22);
                          *pdVar30 = dVar34;
                        }
                        *(double *)(lVar25 + lVar22) = dVar34 + *(double *)(lVar25 + lVar22);
                        lVar12 = lVar12 + 1;
                        lVar22 = lVar22 + 8;
                        iVar18 = iVar18 + -1;
                      } while (iVar18 != 0);
                    }
                    local_1438 = local_1438 + 1;
                    lVar28 = lVar28 + local_1350.jstride * 8;
                    lVar8 = lVar8 + local_1308.jstride * 8;
                    local_1420 = local_1420 + local_1298.jstride * 8;
                    lVar25 = lVar25 + local_13b8._8_8_ * 8;
                    lVar15 = (long)&(local_1368->
                                    super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                    ).
                                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar15;
                    lVar31 = (long)&(((FabArray<amrex::FArrayBox> *)&local_1360->super_FabArrayBase)
                                    ->super_FabArrayBase)._vptr_FabArrayBase + lVar31;
                  } while (local_11a4.bigend.vect[1] + 1U != (int)local_1438);
                }
                uVar5 = (int)local_1230 + 1;
                bVar32 = (int)local_1230 != local_11a4.bigend.vect[2];
                local_1230 = (ulong)uVar5;
              } while (bVar32);
            }
            local_1238 = local_1238 + 1;
            local_11f8 = local_11f8 + local_1168;
            local_1200 = local_1200 + local_1150;
            local_1208 = local_1208 + local_1158;
            local_1210 = local_1210 + local_1160;
          } while (local_1238 != local_1170);
        }
        amrex::MFIter::operator++((MFIter *)local_1050);
      } while ((int)local_1050._32_4_ < (int)local_1050._40_4_);
    }
    amrex::MFIter::~MFIter((MFIter *)local_1050);
    if (8 < local_1250) {
      amrex::MFIter::MFIter((MFIter *)local_1050,(FabArrayBase *)this_00,true);
      if ((int)local_1050._32_4_ < (int)local_1050._40_4_) {
        do {
          amrex::MFIter::tilebox((Box *)&local_1298,(MFIter *)local_1050);
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)local_13b8,this_00,(MFIter *)local_1050);
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_1350,
                     &(S_new->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[1]->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)local_1050,(int)local_1370);
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)&local_1308,
                     &(local_1248->
                      super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[1]->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)local_1050,Rho_comp);
          if ((int)local_1298.jstride <= local_1298.kstride._4_4_) {
            local_12a8 = (FabArray<amrex::FArrayBox> *)local_1308.p;
            lVar27 = (long)(int)local_1298.p;
            local_12b8 = (double *)(lVar27 * 8 + (long)(int)uStack_1398 * -8 + local_13b8._0_8_);
            local_12b0 = local_1350.p + (lVar27 - local_1350.begin.x);
            local_1368 = (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                         (local_1350.kstride * 8);
            local_1360 = (FabArray<amrex::FArrayBox> *)-(long)local_1350.begin.z;
            local_12c0 = CONCAT44(local_1308.kstride._4_4_,(int)local_1308.kstride);
            local_12c8 = (ulong)local_1308.begin.z;
            local_1448 = local_1298.jstride & 0xffffffff;
            do {
              if (local_1298.p._4_4_ <= (int)local_1298.kstride) {
                lVar21 = (long)(int)local_1448;
                iVar18 = local_1298.p._4_4_;
                do {
                  if ((int)local_1298.p <= local_1298.jstride._4_4_) {
                    lVar10 = (long)iVar18;
                    pdVar13 = (double *)
                              ((long)local_12b8 +
                              (lVar10 - uStack_1398._4_4_) * local_13b8._8_8_ * 8 +
                              (lVar21 - local_1390) * local_13b8._16_8_ * 8);
                    pdVar30 = (double *)
                              ((long)local_12b0 +
                              (lVar10 - local_1350.begin.y) * local_1350.jstride * 8 +
                              ((long)&(((FabArray<amrex::FArrayBox> *)
                                       &local_1360->super_FabArrayBase)->super_FabArrayBase).
                                      _vptr_FabArrayBase + lVar21) * (long)local_1368);
                    lVar8 = lVar27;
                    do {
                      pdVar16 = pdVar30;
                      uVar26 = (ulong)(uint)nComp;
                      pdVar23 = pdVar13;
                      if (0 < nComp) {
                        do {
                          *pdVar23 = *pdVar16;
                          pdVar23 = pdVar23 + (long)local_13a0;
                          pdVar16 = pdVar16 + local_1350.nstride;
                          uVar26 = uVar26 - 1;
                        } while (uVar26 != 0);
                        if (rho_flag == 2) {
                          dVar34 = *(double *)
                                    ((long)local_1308.p +
                                    (lVar8 - local_1308.begin.x) * 8 +
                                    (lVar10 - local_1308.begin.y) * local_1308.jstride * 8 +
                                    (lVar21 - local_12c8) * local_12c0 * 8);
                          pdVar16 = pdVar13;
                          uVar26 = (ulong)(uint)nComp;
                          do {
                            *pdVar16 = *pdVar16 * (1.0 / dVar34);
                            pdVar16 = pdVar16 + (long)local_13a0;
                            uVar26 = uVar26 - 1;
                          } while (uVar26 != 0);
                        }
                      }
                      lVar8 = lVar8 + 1;
                      pdVar13 = pdVar13 + 1;
                      pdVar30 = pdVar30 + 1;
                    } while (local_1298.jstride._4_4_ + 1 != (int)lVar8);
                  }
                  bVar32 = iVar18 != (int)local_1298.kstride;
                  iVar18 = iVar18 + 1;
                } while (bVar32);
              }
              bVar32 = (int)local_1448 != local_1298.kstride._4_4_;
              local_1448 = (ulong)((int)local_1448 + 1);
            } while (bVar32);
          }
          amrex::MFIter::operator++((MFIter *)local_1050);
        } while ((int)local_1050._32_4_ < (int)local_1050._40_4_);
      }
      amrex::MFIter::~MFIter((MFIter *)local_1050);
      amrex::MLLinOp::setCoarseFineBC((MLLinOp *)&local_408,(MultiFab *)this_00,cratio->vect[0]);
    }
    amrex::MFIter::MFIter((MFIter *)local_1050,&local_e10.super_FabArrayBase,true);
    if ((int)local_1050._32_4_ < (int)local_1050._40_4_) {
      do {
        amrex::MFIter::growntilebox((Box *)&local_1298,(MFIter *)local_1050,1);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)local_13b8,&local_e10,(MFIter *)local_1050);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_1350,
                   &(*(S_new->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start)->super_FabArray<amrex::FArrayBox>,
                   (MFIter *)local_1050,(int)local_1370);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&local_1308,
                   &(*(local_1248->
                      super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start)->super_FabArray<amrex::FArrayBox>,
                   (MFIter *)local_1050,Rho_comp);
        if ((int)local_1298.jstride <= local_1298.kstride._4_4_) {
          local_12a8 = (FabArray<amrex::FArrayBox> *)local_1308.p;
          lVar27 = (long)(int)local_1298.p;
          local_12b8 = (double *)(lVar27 * 8 + (long)(int)uStack_1398 * -8 + local_13b8._0_8_);
          local_12b0 = local_1350.p + (lVar27 - local_1350.begin.x);
          local_1368 = (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                       (local_1350.kstride * 8);
          local_1360 = (FabArray<amrex::FArrayBox> *)-(long)local_1350.begin.z;
          local_12c0 = CONCAT44(local_1308.kstride._4_4_,(int)local_1308.kstride);
          local_12c8 = (ulong)local_1308.begin.z;
          local_1448 = local_1298.jstride & 0xffffffff;
          do {
            if (local_1298.p._4_4_ <= (int)local_1298.kstride) {
              lVar21 = (long)(int)local_1448;
              iVar18 = local_1298.p._4_4_;
              do {
                if ((int)local_1298.p <= local_1298.jstride._4_4_) {
                  lVar10 = (long)iVar18;
                  pdVar13 = (double *)
                            ((long)local_12b8 +
                            (lVar10 - uStack_1398._4_4_) * local_13b8._8_8_ * 8 +
                            (lVar21 - local_1390) * local_13b8._16_8_ * 8);
                  pdVar30 = (double *)
                            ((long)local_12b0 +
                            (lVar10 - local_1350.begin.y) * local_1350.jstride * 8 +
                            ((long)&(((FabArray<amrex::FArrayBox> *)&local_1360->super_FabArrayBase)
                                    ->super_FabArrayBase)._vptr_FabArrayBase + lVar21) *
                            (long)local_1368);
                  lVar8 = lVar27;
                  do {
                    pdVar16 = pdVar13;
                    pdVar23 = pdVar30;
                    uVar26 = (ulong)(uint)nComp;
                    if (0 < nComp) {
                      do {
                        *pdVar16 = *pdVar23;
                        pdVar16 = pdVar16 + (long)local_13a0;
                        pdVar23 = pdVar23 + local_1350.nstride;
                        uVar26 = uVar26 - 1;
                      } while (uVar26 != 0);
                      if (rho_flag == 2) {
                        dVar34 = *(double *)
                                  ((long)local_1308.p +
                                  (lVar8 - local_1308.begin.x) * 8 +
                                  (lVar10 - local_1308.begin.y) * local_1308.jstride * 8 +
                                  (lVar21 - local_12c8) * local_12c0 * 8);
                        pdVar16 = pdVar13;
                        uVar26 = (ulong)(uint)nComp;
                        do {
                          *pdVar16 = *pdVar16 * (1.0 / dVar34);
                          pdVar16 = pdVar16 + (long)local_13a0;
                          uVar26 = uVar26 - 1;
                        } while (uVar26 != 0);
                      }
                    }
                    lVar8 = lVar8 + 1;
                    pdVar13 = pdVar13 + 1;
                    pdVar30 = pdVar30 + 1;
                  } while (local_1298.jstride._4_4_ + 1 != (int)lVar8);
                }
                bVar32 = iVar18 != (int)local_1298.kstride;
                iVar18 = iVar18 + 1;
              } while (bVar32);
            }
            bVar32 = (int)local_1448 != local_1298.kstride._4_4_;
            local_1448 = (ulong)((int)local_1448 + 1);
          } while (bVar32);
        }
        amrex::MFIter::operator++((MFIter *)local_1050);
      } while ((int)local_1050._32_4_ < (int)local_1050._40_4_);
    }
    amrex::MFIter::~MFIter((MFIter *)local_1050);
    amrex::MLCellLinOp::setLevelBC
              ((MLCellLinOp *)&local_408,0,(MultiFab *)&local_e10,(MultiFab *)0x0,(MultiFab *)0x0,
               (MultiFab *)0x0);
    local_1310 = local_1310 * dVar33;
    local_11e8.p = (double *)0x3ff0000000000000;
    local_13b8._0_8_ = (pointer)0x0;
    local_13b8._8_8_ = (pointer)0x0;
    amrex::MultiFab::MultiFab((MultiFab *)local_1050);
    pDVar19 = local_1218;
    iVar18 = 0;
    if (rho_flag != 1) {
      local_1220 = *(local_1248->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                    ).super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      iVar18 = Rho_comp;
    }
    computeAlpha((MultiFab *)local_1050,(pair<double,_double> *)local_13b8,1.0,local_1310,
                 (Real *)&local_11e8,alpha_in,alpha_in_comp,rho_flag,local_1220,iVar18);
    amrex::MLEBABecLap::setScalars(&local_408,(Real)local_13b8._0_8_,(Real)local_13b8._8_8_);
    amrex::MLEBABecLap::setACoeffs(&local_408,0,(MultiFab *)local_1050);
    amrex::MultiFab::~MultiFab((MultiFab *)local_1050);
    setBeta(&local_408,betanp1,betaComp,nComp);
    amrex::MultiFab::mult((MultiFab *)&local_588,(Real)local_11e8.p,0,nComp,0);
    a_tol_rel = visc_tol;
    a_tol_abs = get_scaled_abs_tol((MultiFab *)&local_588,visc_tol);
    __l_09._M_len = 1;
    __l_09._M_array = (iterator)&local_1350;
    local_1350.p = (double *)&local_e10;
    std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
              ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_1050,__l_09,
               (allocator_type *)&local_1298);
    __l_10._M_len = 1;
    __l_10._M_array = (iterator)&local_1308;
    local_1308.p = (double *)&local_588;
    std::vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
              ((vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
               local_13b8,__l_10,(allocator_type *)&local_ea8);
    amrex::MLMG::solve((MLMG *)local_c90,
                       (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_1050,
                       (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                       local_13b8,a_tol_rel,a_tol_abs,(char *)0x0);
    if ((pointer)local_13b8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_13b8._0_8_,local_13b8._16_8_ - local_13b8._0_8_);
    }
    if ((FabArrayBase *)local_1050._0_8_ != (FabArrayBase *)0x0) {
      operator_delete((void *)local_1050._0_8_,local_1050._16_8_ - local_1050._0_8_);
    }
    computeExtensiveFluxes
              ((MLMG *)local_c90,(MultiFab *)&local_e10,fluxnp1,fluxComp,nComp,
               (MultiFab *)&pDVar19->navier_stokes->field_0x540,local_1310 / dVar33);
    amrex::MFIter::MFIter
              ((MFIter *)local_1050,
               (FabArrayBase *)
               *(S_new->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                super__Vector_impl_data._M_start,true);
    if ((int)local_1050._32_4_ < (int)local_1050._40_4_) {
      if (rho_flag != 2) {
        local_1358 = (int)local_1370;
      }
      do {
        amrex::MFIter::tilebox((Box *)&local_1298,(MFIter *)local_1050);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)local_13b8,
                   &(*(S_new->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start)->super_FabArray<amrex::FArrayBox>,
                   (MFIter *)local_1050,(int)local_1370);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_1350,&local_e10,(MFIter *)local_1050);
        pVVar9 = S_new;
        if (rho_flag == 2) {
          pVVar9 = local_1248;
        }
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&local_1308,
                   &(*(pVVar9->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start)->super_FabArray<amrex::FArrayBox>,
                   (MFIter *)local_1050,local_1358);
        if (0 < nComp) {
          lVar27 = (long)local_1298.p._4_4_;
          lVar21 = (long)(int)local_1298.p;
          local_1450 = (lVar27 - uStack_1398._4_4_) * local_13b8._8_8_ * 8 + lVar21 * 8 +
                       (long)(int)uStack_1398 * -8 + local_13b8._0_8_;
          local_13d8 = (lVar27 - local_1350.begin.y) * local_1350.jstride * 8 + lVar21 * 8 +
                       (long)local_1350.begin.x * -8 + (long)local_1350.p;
          uVar26 = 0;
          do {
            iVar18 = (int)local_1298.jstride;
            if ((int)local_1298.jstride <= local_1298.kstride._4_4_) {
              do {
                if (local_1298.p._4_4_ <= (int)local_1298.kstride) {
                  lVar8 = (long)iVar18;
                  lVar10 = (long)local_1308.p +
                           (lVar8 - local_1308.begin.z) *
                           CONCAT44(local_1308.kstride._4_4_,(int)local_1308.kstride) * 8 +
                           (lVar27 - local_1308.begin.y) * local_1308.jstride * 8 + lVar21 * 8 +
                           (long)local_1308.begin.x * -8;
                  lVar17 = (lVar8 - local_1390) * local_13b8._16_8_ * 8 + local_1450;
                  lVar15 = (lVar8 - local_1350.begin.z) * local_1350.kstride * 8 + local_13d8;
                  lVar8 = lVar27;
                  do {
                    if ((int)local_1298.p <= local_1298.jstride._4_4_) {
                      lVar25 = 0;
                      do {
                        dVar33 = *(double *)(lVar15 + lVar25 * 8);
                        *(double *)(lVar17 + lVar25 * 8) = dVar33;
                        if (rho_flag == 2) {
                          *(double *)(lVar17 + lVar25 * 8) =
                               dVar33 * *(double *)(lVar10 + lVar25 * 8);
                        }
                        lVar25 = lVar25 + 1;
                      } while ((local_1298.jstride._4_4_ - (int)local_1298.p) + 1 != (int)lVar25);
                    }
                    lVar8 = lVar8 + 1;
                    lVar10 = lVar10 + local_1308.jstride * 8;
                    lVar17 = lVar17 + local_13b8._8_8_ * 8;
                    lVar15 = lVar15 + local_1350.jstride * 8;
                  } while ((int)local_1298.kstride + 1 != (int)lVar8);
                }
                bVar32 = iVar18 != local_1298.kstride._4_4_;
                iVar18 = iVar18 + 1;
              } while (bVar32);
            }
            uVar26 = uVar26 + 1;
            local_1450 = local_1450 + (long)local_13a0 * 8;
            local_13d8 = local_13d8 + local_1350.nstride * 8;
          } while (uVar26 != (uint)nComp);
        }
        amrex::MFIter::operator++((MFIter *)local_1050);
      } while ((int)local_1050._32_4_ < (int)local_1050._40_4_);
    }
    amrex::MFIter::~MFIter((MFIter *)local_1050);
    if (verbose != 0) {
      dVar33 = amrex::ParallelDescriptor::second();
      local_1050._8_8_ = amrex::OutStream();
      poVar1 = (ostringstream *)(local_1050 + 0x10);
      local_1050._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
      local_1050._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      *(undefined8 *)
       ((long)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1050._16_8_ + -0x18))->_M_pi[1]
               ._M_use_count + (long)local_1050) =
           *(undefined8 *)
            ((ostream *)(local_1050._8_8_ + 8) + *(long *)(*(long *)local_1050._8_8_ + -0x18));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Diffusion::diffuse_scalar() time: ",0x22);
      std::ostream::_M_insert<double>(dVar33 - local_1188);
      local_13b8[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_13b8,1);
      amrex::Print::~Print((Print *)local_1050);
    }
    amrex::MLMG::~MLMG((MLMG *)local_c90);
    amrex::MLEBABecLap::~MLEBABecLap(&local_408);
    amrex::MLMG::~MLMG(&local_720);
    amrex::MLEBABecLap::~MLEBABecLap((MLEBABecLap *)local_af8);
    (*(this_00->super_FabArrayBase)._vptr_FabArrayBase[1])();
    amrex::MultiFab::~MultiFab((MultiFab *)&local_e10);
    amrex::MultiFab::~MultiFab((MultiFab *)&local_588);
  }
  return;
}

Assistant:

void
Diffusion::diffuse_scalar (const Vector<MultiFab*>&  S_old,
                           const Vector<MultiFab*>&  Rho_old,
                           Vector<MultiFab*>&        S_new,
                           const Vector<MultiFab*>&  Rho_new,
                           int                       S_comp,
                           int                       nComp,
                           int                       Rho_comp,
                           Real                      prev_time,
                           Real                      curr_time,
                           Real                      be_cn_theta,
                           const MultiFab&           rho_half,
                           int                       rho_flag,
                           MultiFab* const*          fluxn,
                           MultiFab* const*          fluxnp1,
                           int                       fluxComp,
                           MultiFab*                 delta_rhs,
                           int                       rhsComp,
                           const MultiFab*           alpha_in,
                           int                       alpha_in_comp,
                           const MultiFab* const*    betan,
                           const MultiFab* const*    betanp1,
                           int                       betaComp,
                           const IntVect&            cratio,
                           const BCRec&              bc,
                           const Geometry&           geom,
                           bool                      add_old_time_divFlux,
                           const amrex::Vector<int>& a_is_diffusive)
{
    //
    // This routine expects that physical BC's have been loaded into
    // the grow cells of the old and new state at this level.  If rho_flag==2,
    // the values there are rho.phi, where phi is the quantity being diffused.
    // Values in these cells will be preserved.  Also, if there are any
    // explicit update terms, these have already incremented the new state
    // on the valid region (i.e., on the valid region the new state is the old
    // state + dt*Div(explicit_fluxes), e.g.)
    //

    if (verbose)
      amrex::Print() << "... Diffusion::diffuse_scalar(): \n"
                     << " lev: " << level << '\n';

    // Velocity components should go to tensor solver
    if (S_comp <= Xvel && Xvel <= S_comp+nComp-1){
       amrex::Abort("Diffusion::diffuse_scalar(): velocity component(s) attemping to use scalar solver. Velocity must use tensor solver.\n");
    }

    // Check if scalars are diffusive type:
    // all the nComp scalars must be of the same type
    int diffType = a_is_diffusive[0];
    for (int comp = 1; comp < nComp; comp++) {
        if (a_is_diffusive[comp] != diffType) {
            amrex::Abort("All the scalars must be either diffusive or non-diffusive when calling diffuse_scalar");
        }
    }

    // If all non-diffusive, set flux to zero and exit
    if (diffType == 0) {
        for (int idim = 0; idim < AMREX_SPACEDIM; idim++)
        {
            if (fluxn[idim]!= 0 && fluxnp1[idim]!= 0)
            {
                fluxn[idim]->setVal(0.0,fluxComp,nComp);
                fluxnp1[idim]->setVal(0.0,fluxComp,nComp);
            }
        }
        return;
    }

    bool has_coarse_data = S_new.size() > 1;

    const Real strt_time = ParallelDescriptor::second();

    int allthere, allnull;
    checkBeta(betan, allthere, allnull);
    checkBeta(betanp1, allthere);
    if (allnull && add_old_time_divFlux && be_cn_theta!=1)
       amrex::Abort("Diffusion::diffuse_scalar: Constant diffusivity case no longer supported separately. Must set non-zero beta.");

    //
    // No ghost cells are needed for MLMG in most cases. Except for
    // for cell-centered solver, you need to call setLevelBC, and that
    // needs to have 1 ghost cell if there is Dirichlet BC.
    //
    const int ng = 1;

    Real dt = curr_time - prev_time;
    AMREX_ASSERT(S_new[0]->nGrow()>0);
    if (S_old.size()>0) AMREX_ASSERT(S_old[0]->nGrow()>0);
    const BoxArray& ba = S_new[0]->boxArray();
    const DistributionMapping& dm = S_new[0]->DistributionMap();
    const DistributionMapping* dmc = (has_coarse_data ? &(S_new[1]->DistributionMap()) : 0);
    const BoxArray* bac = (has_coarse_data ? &(S_new[1]->boxArray()) : 0);

    const auto& factory = S_new[0]->Factory();

    MultiFab Rhs(ba,dm,nComp,0,MFInfo(),factory);
    MultiFab Soln(ba,dm,nComp,ng,MFInfo(),factory);

    auto Solnc = std::unique_ptr<MultiFab>(new MultiFab());
    if (has_coarse_data)
    {
      Solnc->define(*bac, *dmc, nComp, 0, MFInfo(), S_new[1]->Factory());
    }

    std::array<LinOpBCType,AMREX_SPACEDIM> mlmg_lobc;
    std::array<LinOpBCType,AMREX_SPACEDIM> mlmg_hibc;

    //
    // Create operator at time n and n+1
    //
    LPInfo infon;
    infon.setAgglomeration(agglomeration);
    infon.setConsolidation(consolidation);
    infon.setMaxCoarseningLevel(0);

#ifdef AMREX_USE_EB
    const auto& ebf = &(dynamic_cast<EBFArrayBoxFactory const&>(factory));
    MLEBABecLap opn({geom}, {ba}, {dm}, infon, {ebf}, nComp);
#else
    MLABecLaplacian opn({geom}, {ba}, {dm}, infon, {}, nComp);
#endif

    opn.setMaxOrder(max_order);
    MLMG mgn(opn);
    mgn.setVerbose(verbose);

    LPInfo infonp1;
    infonp1.setAgglomeration(agglomeration);
    infonp1.setConsolidation(consolidation);

#ifdef AMREX_USE_EB
    MLEBABecLap opnp1({geom}, {ba}, {dm}, infonp1, {ebf}, nComp);
#else
    MLABecLaplacian opnp1({geom}, {ba}, {dm}, infonp1, {}, nComp);
#endif
    opnp1.setMaxOrder(max_order);

    MLMG mgnp1(opnp1);
    if (use_hypre)
    {
      mgnp1.setBottomSolver(MLMG::BottomSolver::hypre);
      mgnp1.setBottomVerbose(hypre_verbose);
    }
    mgnp1.setMaxFmgIter(max_fmg_iter);
    mgnp1.setVerbose(verbose);

    setDomainBC(mlmg_lobc, mlmg_hibc, bc); // Same for all comps, by assumption
    opn.setDomainBC(mlmg_lobc, mlmg_hibc);
    opnp1.setDomainBC(mlmg_lobc, mlmg_hibc);

    if (verbose)
    {
       amrex::Print() << "diffusing of " << nComp << " scalars \n"
                      << "rho flag "<< rho_flag << "\n";
    }

    int sigma = S_comp;

    if (add_old_time_divFlux && be_cn_theta!=1) {
        Real a = 0.0;
        Real b = -(1.0-be_cn_theta)*dt;

        if(verbose)
             Print()<<"Adding old time diff ...\n";

        {
            if (has_coarse_data) {
                MultiFab::Copy(*Solnc,*S_old[1],sigma,0,nComp,0);
                if (rho_flag == 2) {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
                    for (MFIter mfi(*Solnc, TilingIfNotGPU()); mfi.isValid(); ++mfi)
                    {
                        const Box& bx = mfi.tilebox();
                        auto const& sol_arr = Solnc->array(mfi);
                        auto const& rho_arr = Rho_old[1]->const_array(mfi,Rho_comp);
                        amrex::ParallelFor(bx, [sol_arr, rho_arr, nComp]
                        AMREX_GPU_DEVICE(int i, int j, int k) noexcept
                        {
                            Real rhoInv = 1.0 / rho_arr(i,j,k);
                            for (int n = 0; n < nComp; ++n) {
                               sol_arr(i,j,k,n) *= rhoInv;
                            }
                        });
                    }
                }
                opn.setCoarseFineBC(Solnc.get(), cratio[0]);
            }
            MultiFab::Copy(Soln,*S_old[0],sigma,0,nComp,ng);
            if (rho_flag == 2) {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
                for (MFIter mfi(Soln, TilingIfNotGPU()); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.growntilebox(ng);
                    auto const& sol_arr = Soln.array(mfi);
                    auto const& rho_arr = Rho_old[0]->const_array(mfi,Rho_comp);
                    amrex::ParallelFor(bx, [sol_arr, rho_arr, nComp]
                    AMREX_GPU_DEVICE(int i, int j, int k) noexcept
                    {
                        Real rhoInv = 1.0 / rho_arr(i,j,k);
                        for (int n = 0; n < nComp; ++n) {
                           sol_arr(i,j,k,n) *= rhoInv;
                        }
                    });
                }
            }
            opn.setLevelBC(0, &Soln);
        }

        opn.setScalars(a,b);
        setBeta(opn,betan,betaComp,nComp);

#ifdef AMREX_USE_EB
        MultiFab rhs_tmp(ba,dm,nComp,2,MFInfo(),factory);
        rhs_tmp.setVal(0.);
        mgn.apply({&rhs_tmp},{&Soln});

        const amrex::MultiFab* weights;
        weights = &(ebf->getVolFrac());

        amrex::single_level_weighted_redistribute(rhs_tmp, Rhs, *weights, 0, nComp, geom);
#else
        mgn.apply({&Rhs},{&Soln});
#endif
        computeExtensiveFluxes(mgn, Soln, fluxn, fluxComp, nComp,
			       navier_stokes->area, -b/dt);
    } else {
        for (int idim = 0; idim < AMREX_SPACEDIM; idim++)
        {
          fluxn[idim]->setVal(0.0,fluxComp,nComp);
        }
        Rhs.setVal(0.0);
    }

    // Get local version of the switch
    int has_alpha     = (alpha_in  != 0) ? 1 : 0;
    int has_delta_rhs = (delta_rhs != 0) ? 1 : 0;

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(*S_new[0], TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        auto const& rhs      = Rhs.array(mfi);
        auto const& solution = Soln.array(mfi);
        auto const& snew     = S_new[0]->array(mfi,sigma);
        Array4<const Real> dummy;
        auto const& rhoHalf  = (rho_flag == 1) ? rho_half.const_array(mfi) : dummy;
        auto const& rho_old  = (rho_flag == 3) ? Rho_old[0]->const_array(mfi,Rho_comp) : dummy;
        auto const& alpha    = (has_alpha) ? alpha_in->const_array(mfi,alpha_in_comp) : Soln.const_array(mfi);
        auto const& deltarhs = (has_delta_rhs) ? delta_rhs->const_array(mfi,rhsComp) : Soln.const_array(mfi);
        amrex::ParallelFor(bx, nComp, [rhs, solution, snew, rhoHalf, rho_old, alpha, deltarhs,
                                has_alpha, has_delta_rhs, rho_flag, dt ]
        AMREX_GPU_DEVICE(int i, int j, int k, int n) noexcept
        {
            // Add body sources
            if ( has_delta_rhs ) {
                rhs(i,j,k,n) += deltarhs(i,j,k,n) * dt;
                if ( rho_flag == 1 ) {
                    rhs(i,j,k,n) *= rhoHalf(i,j,k);
                }
            }
            // Always do : copy S_new into Soln
            //             add Soln to Rhs
            solution(i,j,k,n) = snew(i,j,k,n);
            if ( rho_flag == 1) {
                solution(i,j,k,n) *= rhoHalf(i,j,k);
            } else if ( rho_flag == 3 ) {
                solution(i,j,k,n) *= rho_old(i,j,k);
            }
            if ( has_alpha ) {
                solution(i,j,k,n) *= alpha(i,j,k);
            }
            rhs(i,j,k,n) += solution(i,j,k,n);
        });
    }

    //
    // Set C&F solutions, levelBCs and CoarseFineBCs
    //
    if (has_coarse_data) {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(*Solnc, TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            auto const& sol_arr  = Solnc->array(mfi);
            auto const& snew_arr = S_new[1]->const_array(mfi,sigma);
            auto const& rho_arr  = Rho_new[1]->const_array(mfi,Rho_comp);
            amrex::ParallelFor(bx, [sol_arr, snew_arr, rho_arr, nComp, rho_flag]
            AMREX_GPU_DEVICE(int i, int j, int k) noexcept
            {
                for (int n = 0; n < nComp; ++n) {
                   sol_arr(i,j,k,n) = snew_arr(i,j,k,n);
                }
                if (rho_flag == 2) {
                    Real rhoInv = 1.0 / rho_arr(i,j,k);
                    for (int n = 0; n < nComp; ++n) {
                       sol_arr(i,j,k,n) *= rhoInv;
                    }
                }
            });
        }
        opnp1.setCoarseFineBC(Solnc.get(), cratio[0]);
    }
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(Soln, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.growntilebox(ng);
        auto const& sol_arr  = Soln.array(mfi);
        auto const& snew_arr = S_new[0]->const_array(mfi,sigma);
        auto const& rho_arr  = Rho_new[0]->const_array(mfi,Rho_comp);
        amrex::ParallelFor(bx, [sol_arr, snew_arr, rho_arr, nComp, rho_flag]
        AMREX_GPU_DEVICE(int i, int j, int k) noexcept
        {
            for (int n = 0; n < nComp; ++n) {
               sol_arr(i,j,k,n) = snew_arr(i,j,k,n);
            }
            if (rho_flag == 2) {
                Real rhoInv = 1.0 / rho_arr(i,j,k);
                for (int n = 0; n < nComp; ++n) {
                   sol_arr(i,j,k,n) *= rhoInv;
                }
            }
        });
    }
    opnp1.setLevelBC(0, &Soln);

    Real a = 1.0;
    Real b = be_cn_theta*dt;
    Real rhsscale = 1.0;
    {
        std::pair<Real,Real> scalars;
        MultiFab alpha;
        const MultiFab* rho = (rho_flag == 1) ? &rho_half : Rho_new[0];
        int rhoComp = (rho_flag == 1 ) ? 0 : Rho_comp;

        computeAlpha(alpha, scalars, a, b,
                     &rhsscale, alpha_in, alpha_in_comp,
                     rho_flag, rho, rhoComp);
        opnp1.setScalars(scalars.first, scalars.second);
        opnp1.setACoeffs(0, alpha);
    }

    setBeta(opnp1,betanp1,betaComp,nComp);

    Rhs.mult(rhsscale,0,nComp);
    const Real S_tol     = visc_tol;
    const Real S_tol_abs = get_scaled_abs_tol(Rhs, visc_tol);

    mgnp1.solve({&Soln}, {&Rhs}, S_tol, S_tol_abs);

    computeExtensiveFluxes(mgnp1, Soln, fluxnp1, fluxComp, nComp,
			   navier_stokes->area, b/dt);

    //
    // Copy into state variable at new time, without bc's and * rho if needed
    //
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(*S_new[0], TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
       const Box& bx = mfi.tilebox();
       const auto& snew     = S_new[0]->array(mfi, sigma);
       const auto& solution = Soln.const_array(mfi);
       const auto& rhonew   = (rho_flag == 2) ? Rho_new[0]->const_array(mfi,Rho_comp) : S_new[0]->const_array(mfi,sigma);
       amrex::ParallelFor(bx, nComp, [snew, solution, rhonew, rho_flag]
       AMREX_GPU_DEVICE(int i, int j, int k, int n) noexcept
       {
          snew(i,j,k,n) = solution(i,j,k,n);
          if (rho_flag == 2) {
             snew(i,j,k,n) *= rhonew(i,j,k);
          }
       });
    }

    if (verbose) {
       const int IOProc   = ParallelDescriptor::IOProcessorNumber();
       Real      run_time = ParallelDescriptor::second() - strt_time;
       ParallelDescriptor::ReduceRealMax(run_time,IOProc);
       amrex::Print() << "Diffusion::diffuse_scalar() time: " << run_time << '\n';
    }
}